

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuc_freqs_from_fasta.cpp
# Opt level: O0

void handle_a_sequence(StringBuffer *current_sequence,long *resolutions,long firstSequenceLength)

{
  char *pcVar1;
  long *plVar2;
  long in_RDX;
  long in_RSI;
  StringBuffer *in_RDI;
  long *res;
  long c;
  uchar *s;
  long resolution_index;
  long local_30;
  long local_20;
  
  local_20 = 0;
  pcVar1 = StringBuffer::getString(in_RDI);
  for (local_30 = 0; local_30 < in_RDX; local_30 = local_30 + 1) {
    plVar2 = resolve_char(pcVar1[local_30],false,true);
    *(long *)(in_RSI + local_20 * 8) = *plVar2 + *(long *)(in_RSI + local_20 * 8);
    *(long *)(in_RSI + 8 + local_20 * 8) = plVar2[1] + *(long *)(in_RSI + 8 + local_20 * 8);
    *(long *)(in_RSI + 0x10 + local_20 * 8) = plVar2[2] + *(long *)(in_RSI + 0x10 + local_20 * 8);
    *(long *)(in_RSI + 0x18 + local_20 * 8) = plVar2[3] + *(long *)(in_RSI + 0x18 + local_20 * 8);
    local_20 = local_20 + 4;
  }
  return;
}

Assistant:

void handle_a_sequence (StringBuffer& current_sequence, long * resolutions, const long firstSequenceLength) {
    long resolution_index = 0;
    const unsigned char *s = (const unsigned char *)current_sequence.getString();
    for (long c = 0; c < firstSequenceLength; c++, resolution_index+=4) {
        const long * res = resolve_char(s[c]);
        resolutions [resolution_index] += res[0];
        resolutions [resolution_index+1] += res[1];
        resolutions [resolution_index+2] += res[2];
        resolutions [resolution_index+3] += res[3];
    }
}